

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Capturer::captureValue(Capturer *this,size_t index,string *value)

{
  pointer pMVar1;
  
  pMVar1 = (this->m_messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (ulong)(((long)(this->m_messages).
                             super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x48)) {
    std::__cxx11::string::append((string *)&pMVar1[index].message);
    (*this->m_resultCapture->_vptr_IResultCapture[6])
              (this->m_resultCapture,
               (this->m_messages).
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
               super__Vector_impl_data._M_start + index);
    this->m_captured = this->m_captured + 1;
    return;
  }
  __assert_fail("index < m_messages.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/CLIUtils[P]CLI11/build_O2/tests/catch2/catch.hpp"
                ,0x2e9c,"void Catch::Capturer::captureValue(size_t, const std::string &)");
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }